

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O3

void link_stream(st_quicly_default_scheduler_state_t *sched,quicly_stream_t *stream,
                int conn_is_blocked)

{
  quicly_linklist_t *pqVar1;
  st_quicly_linklist_t *psVar2;
  int iVar3;
  
  pqVar1 = &(stream->_send_aux).pending_link.default_scheduler;
  if ((stream->_send_aux).pending_link.default_scheduler.prev == pqVar1) {
    if (conn_is_blocked != 0) {
      iVar3 = quicly_stream_can_send(stream,0);
      if ((stream->_send_aux).pending_link.default_scheduler.prev != pqVar1) {
        __assert_fail("!quicly_linklist_is_linked(n)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/linklist.h"
                      ,0x38,"void quicly_linklist_insert(quicly_linklist_t *, quicly_linklist_t *)")
        ;
      }
      sched = (st_quicly_default_scheduler_state_t *)(&sched->active + (iVar3 == 0));
    }
    psVar2 = (sched->active).prev;
    (stream->_send_aux).pending_link.default_scheduler.prev = psVar2;
    (stream->_send_aux).pending_link.default_scheduler.next = psVar2->next;
    psVar2->next = pqVar1;
    ((stream->_send_aux).pending_link.default_scheduler.next)->prev = pqVar1;
  }
  return;
}

Assistant:

static void link_stream(struct st_quicly_default_scheduler_state_t *sched, quicly_stream_t *stream, int conn_is_blocked)
{
    if (!quicly_linklist_is_linked(&stream->_send_aux.pending_link.default_scheduler)) {
        quicly_linklist_t *slot = &sched->active;
        if (conn_is_blocked && !quicly_stream_can_send(stream, 0))
            slot = &sched->blocked;
        quicly_linklist_insert(slot->prev, &stream->_send_aux.pending_link.default_scheduler);
    }
}